

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debuginfo.cpp
# Opt level: O0

void __thiscall DebugInfo::ComputeDerivedData(DebugInfo *this)

{
  uint32_t uVar1;
  bool bVar2;
  reference pSVar3;
  pointer ppVar4;
  reference pvVar5;
  size_type sVar6;
  reference pvVar7;
  reference pCVar8;
  reference pvVar9;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_int>_>::value,_pair<iterator,_bool>_>
  _Var10;
  ContribInfo *ctr;
  iterator __end1_1;
  iterator __begin1_1;
  vector<ContribInfo,_std::allocator<ContribInfo>_> *__range1_1;
  TemplateInfo info;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_d0;
  _Self local_a8;
  int local_9c;
  iterator iStack_98;
  int index;
  iterator it;
  bool isTemplate;
  string local_80 [8];
  string templateName;
  SymbolInfo *sym;
  iterator __end1;
  iterator __begin1;
  vector<SymbolInfo,_std::allocator<SymbolInfo>_> *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  templateToIndex;
  DebugInfo *this_local;
  
  templateToIndex._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)&__range1);
  __end1 = std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>::begin(&this->m_Symbols);
  sym = (SymbolInfo *)std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>::end(&this->m_Symbols);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<SymbolInfo_*,_std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>_>
                                     *)&sym), bVar2) {
    pSVar3 = __gnu_cxx::
             __normal_iterator<SymbolInfo_*,_std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string(local_80,(string *)pSVar3);
    it._M_node._3_1_ = StripTemplateParams((string *)local_80);
    if ((bool)it._M_node._3_1_) {
      iStack_98 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          *)&__range1,(key_type *)local_80);
      local_a8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)&__range1);
      bVar2 = std::operator!=(&stack0xffffffffffffff68,&local_a8);
      if (bVar2) {
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                 ::operator->(&stack0xffffffffffffff68);
        local_9c = ppVar4->second;
        uVar1 = pSVar3->size;
        pvVar5 = std::vector<TemplateInfo,_std::allocator<TemplateInfo>_>::operator[]
                           (&this->m_Templates,(long)local_9c);
        pvVar5->size = uVar1 + pvVar5->size;
        pvVar5 = std::vector<TemplateInfo,_std::allocator<TemplateInfo>_>::operator[]
                           (&this->m_Templates,(long)local_9c);
        pvVar5->count = pvVar5->count + 1;
      }
      else {
        sVar6 = std::vector<TemplateInfo,_std::allocator<TemplateInfo>_>::size(&this->m_Templates);
        local_9c = (int)sVar6;
        std::make_pair<std::__cxx11::string&,int&>
                  (&local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   &local_9c);
        _Var10 = std::
                 map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                 ::insert<std::pair<std::__cxx11::string,int>>
                           ((map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                             *)&__range1,&local_d0);
        info._32_8_ = _Var10.first._M_node;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
        ~pair(&local_d0);
        TemplateInfo::TemplateInfo((TemplateInfo *)&__range1_1);
        std::__cxx11::string::operator=((string *)&__range1_1,local_80);
        info._28_4_ = 1;
        info._24_4_ = pSVar3->size;
        std::vector<TemplateInfo,std::allocator<TemplateInfo>>::emplace_back<TemplateInfo&>
                  ((vector<TemplateInfo,std::allocator<TemplateInfo>> *)&this->m_Templates,
                   (TemplateInfo *)&__range1_1);
        TemplateInfo::~TemplateInfo((TemplateInfo *)&__range1_1);
      }
    }
    if (pSVar3->sectionType == Code) {
      uVar1 = pSVar3->size;
      pvVar9 = std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::operator[]
                         (&this->m_ObjectFiles,(long)pSVar3->objectFileIndex);
      pvVar9->codeSize = uVar1 + pvVar9->codeSize;
      uVar1 = pSVar3->size;
      pvVar7 = std::vector<NamespaceInfo,_std::allocator<NamespaceInfo>_>::operator[]
                         (&this->m_Namespaces,(long)pSVar3->namespaceIndex);
      pvVar7->codeSize = uVar1 + pvVar7->codeSize;
    }
    else if (pSVar3->sectionType == Data) {
      uVar1 = pSVar3->size;
      pvVar9 = std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::operator[]
                         (&this->m_ObjectFiles,(long)pSVar3->objectFileIndex);
      pvVar9->dataSize = uVar1 + pvVar9->dataSize;
      uVar1 = pSVar3->size;
      pvVar7 = std::vector<NamespaceInfo,_std::allocator<NamespaceInfo>_>::operator[]
                         (&this->m_Namespaces,(long)pSVar3->namespaceIndex);
      pvVar7->dataSize = uVar1 + pvVar7->dataSize;
    }
    std::__cxx11::string::~string(local_80);
    __gnu_cxx::
    __normal_iterator<SymbolInfo_*,_std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>_>::
    operator++(&__end1);
  }
  __end1_1 = std::vector<ContribInfo,_std::allocator<ContribInfo>_>::begin(&this->m_Contribs);
  ctr = (ContribInfo *)
        std::vector<ContribInfo,_std::allocator<ContribInfo>_>::end(&this->m_Contribs);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<ContribInfo_*,_std::vector<ContribInfo,_std::allocator<ContribInfo>_>_>
                             *)&ctr), bVar2) {
    pCVar8 = __gnu_cxx::
             __normal_iterator<ContribInfo_*,_std::vector<ContribInfo,_std::allocator<ContribInfo>_>_>
             ::operator*(&__end1_1);
    if (pCVar8->sectionType == Code) {
      uVar1 = pCVar8->size;
      pvVar9 = std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::operator[]
                         (&this->m_ObjectFiles,(long)pCVar8->objectFileIndex);
      pvVar9->contribCodeSize = uVar1 + pvVar9->contribCodeSize;
    }
    else if (pCVar8->sectionType == Data) {
      uVar1 = pCVar8->size;
      pvVar9 = std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::operator[]
                         (&this->m_ObjectFiles,(long)pCVar8->objectFileIndex);
      pvVar9->contribDataSize = uVar1 + pvVar9->contribDataSize;
    }
    __gnu_cxx::
    __normal_iterator<ContribInfo_*,_std::vector<ContribInfo,_std::allocator<ContribInfo>_>_>::
    operator++(&__end1_1);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)&__range1);
  return;
}

Assistant:

void DebugInfo::ComputeDerivedData()
{
    std::map<std::string, int> templateToIndex;

    for (const auto& sym : m_Symbols)
    {
        // aggregate templates
        std::string templateName = sym.name;
        bool isTemplate = StripTemplateParams(templateName);
        if (isTemplate)
        {
            auto it = templateToIndex.find(templateName);
            int index;
            if (it != templateToIndex.end())
            {
                index = it->second;
                m_Templates[index].size += sym.size;
                m_Templates[index].count++;
            }
            else
            {
                index = int(m_Templates.size());
                templateToIndex.insert(std::make_pair(templateName, index));
                TemplateInfo info;
                info.name = templateName;
                info.count = 1;
                info.size = sym.size;
                m_Templates.emplace_back(info);
            }
        }

        // aggregate object file / namespace sizes
        if (sym.sectionType == SectionType::Code)
        {
            m_ObjectFiles[sym.objectFileIndex].codeSize += sym.size;
            m_Namespaces[sym.namespaceIndex].codeSize += sym.size;
        }
        else if (sym.sectionType == SectionType::Data)
        {
            m_ObjectFiles[sym.objectFileIndex].dataSize += sym.size;
            m_Namespaces[sym.namespaceIndex].dataSize += sym.size;
        }
    }

    for (const auto& ctr : m_Contribs)
    {
        // aggregate object file / namespace sizes
        if (ctr.sectionType == SectionType::Code)
        {
            m_ObjectFiles[ctr.objectFileIndex].contribCodeSize += ctr.size;
        }
        else if (ctr.sectionType == SectionType::Data)
        {
            m_ObjectFiles[ctr.objectFileIndex].contribDataSize += ctr.size;
        }
    }
}